

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void save_node_stats(log_multi *d)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  node *pnVar5;
  node_pred *pnVar6;
  long in_RDI;
  log_multi *b;
  uint32_t total;
  uint32_t j;
  uint32_t i;
  FILE *fp;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  __stream = fopen64("atxm_debug.csv","wt");
  local_14 = 0;
  while( true ) {
    sVar4 = v_array<node>::size((v_array<node> *)(in_RDI + 8));
    if (sVar4 <= local_14) break;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    bVar2 = pnVar5->internal;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    dVar1 = pnVar5->Eh;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    uVar3 = pnVar5->n;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    fprintf(__stream,"Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n",dVar1 / (double)uVar3,
            (ulong)local_14,(ulong)(bVar2 & 1),(ulong)pnVar5->n);
    fprintf(__stream,"Label:, ");
    local_18 = 0;
    while( true ) {
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      sVar4 = v_array<node_pred>::size(&pnVar5->preds);
      if (sVar4 <= local_18) break;
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      pnVar6 = v_array<node_pred>::operator[](&pnVar5->preds,(ulong)local_18);
      fprintf(__stream,"%6d,",(ulong)pnVar6->label);
      local_18 = local_18 + 1;
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"Ehk:, ");
    local_18 = 0;
    while( true ) {
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      sVar4 = v_array<node_pred>::size(&pnVar5->preds);
      if (sVar4 <= local_18) break;
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      pnVar6 = v_array<node_pred>::operator[](&pnVar5->preds,(ulong)local_18);
      dVar1 = pnVar6->Ehk;
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      pnVar6 = v_array<node_pred>::operator[](&pnVar5->preds,(ulong)local_18);
      fprintf(__stream,"%7.4f,",dVar1 / (double)pnVar6->nk);
      local_18 = local_18 + 1;
    }
    fprintf(__stream,"\n");
    local_1c = 0;
    fprintf(__stream,"nk:, ");
    local_18 = 0;
    while( true ) {
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      sVar4 = v_array<node_pred>::size(&pnVar5->preds);
      if (sVar4 <= local_18) break;
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      pnVar6 = v_array<node_pred>::operator[](&pnVar5->preds,(ulong)local_18);
      fprintf(__stream,"%6d,",(ulong)pnVar6->nk);
      pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
      pnVar6 = v_array<node_pred>::operator[](&pnVar5->preds,(ulong)local_18);
      local_1c = pnVar6->nk + local_1c;
      local_18 = local_18 + 1;
    }
    fprintf(__stream,"\n");
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    uVar3 = pnVar5->max_count_label;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    fprintf(__stream,"max(lab:cnt:tot):, %3d,%6d,%7d,\n",(ulong)uVar3,(ulong)pnVar5->max_count,
            (ulong)local_1c);
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    uVar3 = pnVar5->left;
    pnVar5 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_14);
    fprintf(__stream,"left: %4d, right: %4d",(ulong)uVar3,(ulong)pnVar5->right);
    fprintf(__stream,"\n\n");
    local_14 = local_14 + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void save_node_stats(log_multi& d)
{
  FILE* fp;
  uint32_t i, j;
  uint32_t total;
  log_multi* b = &d;

  fp = fopen("atxm_debug.csv", "wt");

  for (i = 0; i < b->nodes.size(); i++)
  {
    fprintf(fp, "Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n", (int)i, (int)b->nodes[i].internal,
        b->nodes[i].Eh / b->nodes[i].n, b->nodes[i].n);

    fprintf(fp, "Label:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].label);
    }
    fprintf(fp, "\n");

    fprintf(fp, "Ehk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%7.4f,", b->nodes[i].preds[j].Ehk / b->nodes[i].preds[j].nk);
    }
    fprintf(fp, "\n");

    total = 0;

    fprintf(fp, "nk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].nk);
      total += b->nodes[i].preds[j].nk;
    }
    fprintf(fp, "\n");

    fprintf(fp, "max(lab:cnt:tot):, %3d,%6d,%7d,\n", (int)b->nodes[i].max_count_label, (int)b->nodes[i].max_count,
        (int)total);
    fprintf(fp, "left: %4d, right: %4d", (int)b->nodes[i].left, (int)b->nodes[i].right);
    fprintf(fp, "\n\n");
  }

  fclose(fp);
}